

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.hpp
# Opt level: O0

int __thiscall
zmq::detail::socket_base::setsockopt
          (socket_base *this,int __fd,int __level,int __optname,void *__optval,socklen_t __optlen)

{
  int iVar1;
  undefined8 uVar2;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  int rc;
  error_t *in_stack_ffffffffffffffd0;
  
  iVar1 = zmq_setsockopt(this->_handle,__fd,CONCAT44(in_register_00000014,__level),
                         CONCAT44(in_register_0000000c,__optname));
  if (iVar1 != 0) {
    uVar2 = __cxa_allocate_exception(0x10);
    error_t::error_t(in_stack_ffffffffffffffd0);
    __cxa_throw(uVar2,&error_t::typeinfo,error_t::~error_t);
  }
  return iVar1;
}

Assistant:

void setsockopt(int option_, const void *optval_, size_t optvallen_)
    {
        int rc = zmq_setsockopt(_handle, option_, optval_, optvallen_);
        if (rc != 0)
            throw error_t();
    }